

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

Image * vera::scale(Image *__return_storage_ptr__,Image *_image,int _width,int _height)

{
  uint uVar1;
  pointer pBVar2;
  pointer pBVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  long lVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  undefined8 in_XMM1_Qa;
  undefined8 local_c8;
  undefined8 uStack_c0;
  ulong local_b0;
  ulong local_a8;
  ulong local_a0;
  long local_98;
  ulong local_90;
  double local_88;
  vector<vera::BicubicPrecalc,_std::allocator<vera::BicubicPrecalc>_> vPrecalcs;
  vector<vera::BicubicPrecalc,_std::allocator<vera::BicubicPrecalc>_> hPrecalcs;
  vec<4,_float,_(glm::qualifier)0> local_50;
  vec<4,_float,_(glm::qualifier)0> local_40;
  
  iVar5 = (*_image->_vptr_Image[8])(_image);
  Image::Image(__return_storage_ptr__,_width,_height,iVar5);
  std::vector<vera::BicubicPrecalc,_std::allocator<vera::BicubicPrecalc>_>::vector
            (&hPrecalcs,(long)_width,(allocator_type *)&vPrecalcs);
  std::vector<vera::BicubicPrecalc,_std::allocator<vera::BicubicPrecalc>_>::vector
            (&vPrecalcs,(long)_height,(allocator_type *)&local_c8);
  iVar5 = (*_image->_vptr_Image[6])(_image);
  ResampleBicubicPrecalc(&hPrecalcs,iVar5);
  iVar5 = (*_image->_vptr_Image[7])(_image);
  ResampleBicubicPrecalc(&vPrecalcs,iVar5);
  uVar13 = 0;
  local_a0 = (ulong)(uint)_width;
  if (_width < 1) {
    local_a0 = uVar13;
  }
  if (_height < 1) {
    _height = 0;
  }
  uVar10 = (ulong)(uint)_height;
  local_b0 = uVar10;
  while (pBVar2 = vPrecalcs.
                  super__Vector_base<vera::BicubicPrecalc,_std::allocator<vera::BicubicPrecalc>_>.
                  _M_impl.super__Vector_impl_data._M_start, uVar13 != uVar10) {
    lVar7 = 0;
    uVar12 = uVar13;
    local_a8 = uVar13;
    for (uVar8 = 0;
        pBVar3 = hPrecalcs.
                 super__Vector_base<vera::BicubicPrecalc,_std::allocator<vera::BicubicPrecalc>_>.
                 _M_impl.super__Vector_impl_data._M_start, uVar8 != local_a0; uVar8 = uVar8 + 1) {
      local_c8 = 0;
      uStack_c0 = 0;
      lVar4 = -1;
      local_98 = lVar7;
      local_90 = uVar8;
      while (lVar11 = lVar4, uVar8 = local_90, uVar12 = local_a8, lVar11 != 3) {
        iVar5 = pBVar2[uVar13].offset[lVar11 + 1];
        for (lVar9 = 0; lVar4 = lVar11 + 1, lVar9 != 4; lVar9 = lVar9 + 1) {
          iVar6 = *(int *)((long)pBVar3->offset + lVar9 * 4 + lVar7);
          (*_image->_vptr_Image[6])(_image);
          local_88 = pBVar2[uVar13].weight[lVar11 + 1] *
                     *(double *)((long)pBVar3->weight + lVar9 * 8 + lVar7);
          iVar6 = (*_image->_vptr_Image[0xe])(_image,(long)iVar6,(long)iVar5);
          (*_image->_vptr_Image[0x19])(_image,CONCAT44(extraout_var,iVar6));
          local_50.field_2 = SUB84(in_XMM1_Qa,0);
          local_50.field_3 = SUB84((ulong)in_XMM1_Qa >> 0x20,0);
          local_40 = glm::operator*(&local_50,(float)local_88);
          in_XMM1_Qa = local_40._8_8_;
          glm::vec<4,float,(glm::qualifier)0>::operator+=
                    ((vec<4,float,(glm::qualifier)0> *)&local_c8,&local_40);
        }
      }
      uVar1 = __return_storage_ptr__->m_channels;
      uVar10 = 4;
      if ((int)uVar1 < 4) {
        uVar10 = (ulong)uVar1;
      }
      (*__return_storage_ptr__->_vptr_Image[0x12])
                (__return_storage_ptr__,
                 ((long)__return_storage_ptr__->m_width * local_a8 + local_90) * (long)(int)uVar1,
                 &local_c8,uVar10);
      lVar7 = local_98 + 0x30;
      uVar10 = local_b0;
    }
    uVar13 = uVar12 + 1;
  }
  std::_Vector_base<vera::BicubicPrecalc,_std::allocator<vera::BicubicPrecalc>_>::~_Vector_base
            (&vPrecalcs.
              super__Vector_base<vera::BicubicPrecalc,_std::allocator<vera::BicubicPrecalc>_>);
  std::_Vector_base<vera::BicubicPrecalc,_std::allocator<vera::BicubicPrecalc>_>::~_Vector_base
            (&hPrecalcs.
              super__Vector_base<vera::BicubicPrecalc,_std::allocator<vera::BicubicPrecalc>_>);
  return __return_storage_ptr__;
}

Assistant:

Image scale(const Image& _image, int _width, int _height) {
    Image out = Image(_width, _height, _image.getChannels());

     // Precalculate weights
    std::vector<BicubicPrecalc> hPrecalcs(_width);
    std::vector<BicubicPrecalc> vPrecalcs(_height);

    ResampleBicubicPrecalc(hPrecalcs, _image.getWidth());
    ResampleBicubicPrecalc(vPrecalcs, _image.getHeight());

    for (int dsty = 0; dsty < _height; dsty++ ) {
        // We need to calculate the source pixel to interpolate from - Y-axis
        const BicubicPrecalc& vPrecalc = vPrecalcs[dsty];

        for (int dstx = 0; dstx < _width; dstx++ ) {
            // X-axis of pixel to interpolate from
            const BicubicPrecalc& hPrecalc = hPrecalcs[dstx];

            // Sums for each color channel
            glm::vec4 sum = glm::vec4(0.0f);

            // Here we actually determine the RGBA values for the destination pixel
            for ( int k = -1; k <= 2; k++ ) {
                // Y offset
                const int y_offset = vPrecalc.offset[k + 1];

                // Loop across the X axis
                for ( int i = -1; i <= 2; i++ ) {
                    // X offset
                    const int x_offset = hPrecalc.offset[i + 1];

                    // Calculate the exact position where the source data
                    // should be pulled from based on the x_offset and y_offset
                    int src_pixel_index = y_offset * _image.getWidth() + x_offset;

                    // Calculate the weight for the specified pixel according
                    // to the bicubic b-spline kernel we're using for
                    // interpolation
                    const float pixel_weight = vPrecalc.weight[k + 1] * hPrecalc.weight[i + 1];
                    sum += _image.getColor( _image.getIndex(x_offset, y_offset) ) * pixel_weight;
                }
            }
            out.setColor(out.getIndex(dstx, dsty), sum);
        }
    }
    return out;
}